

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reachability_graph.hh
# Opt level: O2

void __thiscall
tchecker::graph::reachability::
graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
::graph_t(graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
          *this,size_t block_size,size_t table_size,node_hash_t *node_hash,
         node_equal_to_t *node_equal_to)

{
  this->_vptr_graph_t = (_func_int **)&PTR__graph_t_002570c8;
  hashtable_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::graph::reachability::graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>::node_sptr_hash_t,_tchecker::graph::reachability::graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>::node_sptr_equal_to_t>
  ::hashtable_t(&(this->_find_graph)._nodes,table_size,(node_sptr_hash_t *)&this->field_0x8,
                (node_sptr_equal_to_t *)&this->field_0x9);
  node_pool_allocator_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::node_pool_allocator_t(&this->_node_pool,block_size);
  edge_pool_allocator_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::edge_pool_allocator_t(&this->_edge_pool,block_size);
  return;
}

Assistant:

graph_t(std::size_t block_size, std::size_t table_size, NODE_HASH const & node_hash, NODE_EQUAL const & node_equal_to)
      : _node_sptr_hash(node_hash), _node_sptr_equal_to(node_equal_to),
        _find_graph(table_size, _node_sptr_hash, _node_sptr_equal_to), _node_pool(block_size), _edge_pool(block_size)
  {
  }